

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

Vector<unsigned_int,_4> __thiscall
tcu::sampleTextureBorder<unsigned_int>(tcu *this,TextureFormat *format,Sampler *sampler)

{
  TextureChannelClass TVar1;
  undefined8 extraout_RDX;
  Vector<unsigned_int,_4> VVar3;
  tcu local_30 [16];
  undefined8 uVar2;
  
  TVar1 = getTextureChannelClass(format->type);
  switch(TVar1) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    getTextureBorderColorFloat(local_30,format,sampler);
    VVar3 = Vector<float,_4>::cast<unsigned_int>((Vector<float,_4> *)this);
    uVar2 = VVar3.m_data._8_8_;
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    getTextureBorderColorInt(local_30,format,sampler);
    VVar3 = Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)this);
    uVar2 = VVar3.m_data._8_8_;
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    getTextureBorderColorUint(local_30,format,sampler);
    VVar3 = Vector<unsigned_int,_4>::cast<unsigned_int>((Vector<unsigned_int,_4> *)this);
    uVar2 = VVar3.m_data._8_8_;
    break;
  default:
    Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)this);
    uVar2 = extraout_RDX;
  }
  VVar3.m_data[2] = (int)uVar2;
  VVar3.m_data[3] = (int)((ulong)uVar2 >> 0x20);
  VVar3.m_data._0_8_ = this;
  return (Vector<unsigned_int,_4>)VVar3.m_data;
}

Assistant:

tcu::Vector<ScalarType, 4> sampleTextureBorder (const TextureFormat& format, const Sampler& sampler)
{
	const tcu::TextureChannelClass channelClass = getTextureChannelClass(format.type);

	switch (channelClass)
	{
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			return getTextureBorderColorFloat(format, sampler).cast<ScalarType>();

		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			return getTextureBorderColorInt(format, sampler).cast<ScalarType>();

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			return getTextureBorderColorUint(format, sampler).cast<ScalarType>();

		default:
			DE_ASSERT(false);
			return tcu::Vector<ScalarType, 4>();
	}
}